

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_compress4X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int flags)

{
  size_t sVar1;
  void *pvVar2;
  void *pvVar3;
  ulong srcSize_00;
  
  if (0xb < srcSize && 0x10 < dstSize) {
    srcSize_00 = srcSize + 3 >> 2;
    sVar1 = HUF_compress1X_usingCTable_internal
                      ((void *)((long)dst + 6),dstSize - 6,src,srcSize_00,CTable,flags);
    if (0xffffffffffffff88 < sVar1) {
      return sVar1;
    }
    if (0xffffffffffff0000 < sVar1 - 0x10000) {
      *(short *)dst = (short)sVar1;
      pvVar3 = (void *)((long)dst + 6 + sVar1);
      sVar1 = HUF_compress1X_usingCTable_internal
                        (pvVar3,(long)dst + (dstSize - (long)pvVar3),
                         (void *)((long)src + srcSize_00),srcSize_00,CTable,flags);
      if (0xffffffffffffff88 < sVar1) {
        return sVar1;
      }
      if (0xffffffffffff0000 < sVar1 - 0x10000) {
        *(short *)((long)dst + 2) = (short)sVar1;
        pvVar3 = (void *)((long)pvVar3 + sVar1);
        pvVar2 = (void *)((long)((long)src + srcSize_00) + srcSize_00);
        sVar1 = HUF_compress1X_usingCTable_internal
                          (pvVar3,(long)dst + (dstSize - (long)pvVar3),pvVar2,srcSize_00,CTable,
                           flags);
        if (0xffffffffffffff88 < sVar1) {
          return sVar1;
        }
        if (0xffffffffffff0000 < sVar1 - 0x10000) {
          *(short *)((long)dst + 4) = (short)sVar1;
          pvVar3 = (void *)((long)pvVar3 + sVar1);
          pvVar2 = (void *)((long)pvVar2 + srcSize_00);
          sVar1 = HUF_compress1X_usingCTable_internal
                            (pvVar3,(long)dst + (dstSize - (long)pvVar3),pvVar2,
                             (long)src + (srcSize - (long)pvVar2),CTable,flags);
          if (0xffffffffffffff88 < sVar1) {
            return sVar1;
          }
          if (0xffffffffffff0000 < sVar1 - 0x10000) {
            return (long)pvVar3 + (sVar1 - (long)dst);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static size_t
HUF_compress4X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, int flags)
{
    size_t const segmentSize = (srcSize+3)/4;   /* first 3 segments */
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    BYTE* const ostart = (BYTE*) dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    if (dstSize < 6 + 1 + 1 + 1 + 8) return 0;   /* minimum space to compress successfully */
    if (srcSize < 12) return 0;   /* no saving possible : too small input */
    op += 6;   /* jumpTable */

    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart+2, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart+4, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    assert(ip <= iend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, (size_t)(iend-ip), CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        op += cSize;
    }

    return (size_t)(op-ostart);
}